

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_soa.cpp
# Opt level: O1

pair<embree::NodeRefPtr<4>,_embree::BBox<embree::Vec3fa>_> * __thiscall
embree::sse2::GridSOA::buildBVH
          (pair<embree::NodeRefPtr<4>,_embree::BBox<embree::Vec3fa>_> *__return_storage_ptr__,
          GridSOA *this,BBox3fa *bounds_o)

{
  undefined8 uVar1;
  size_t allocator;
  GridRange range;
  size_t local_30;
  GridRange local_28;
  
  local_30 = 0;
  local_28.u_end = this->width - 1;
  local_28.v_end = this->height - 1;
  local_28.u_start = 0;
  local_28.v_start = 0;
  buildBVH(__return_storage_ptr__,this,&local_28,&local_30);
  if (bounds_o != (BBox3fa *)0x0) {
    uVar1 = *(undefined8 *)((long)&(__return_storage_ptr__->second).lower.field_0 + 8);
    *(undefined8 *)&(bounds_o->lower).field_0 =
         *(undefined8 *)&(__return_storage_ptr__->second).lower.field_0;
    *(undefined8 *)((long)&(bounds_o->lower).field_0 + 8) = uVar1;
    uVar1 = *(undefined8 *)((long)&(__return_storage_ptr__->second).upper.field_0 + 8);
    *(undefined8 *)&(bounds_o->upper).field_0 =
         *(undefined8 *)&(__return_storage_ptr__->second).upper.field_0;
    *(undefined8 *)((long)&(bounds_o->upper).field_0 + 8) = uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<BVH4::NodeRef,BBox3fa> GridSOA::buildBVH(BBox3fa* bounds_o)
    {
      size_t allocator = 0;
      GridRange range(0,width-1,0,height-1);
      std::pair<BVH4::NodeRef,BBox3fa> root_bounds = buildBVH(range,allocator);
      if (bounds_o) *bounds_o = root_bounds.second;
      assert(allocator == gridOffset);
      return root_bounds;
    }